

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::RegisterTests
          (ParameterizedTestSuiteInfo<P256NistzImplTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  pointer pcVar2;
  element_type *peVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
  _Var4;
  code *pcVar5;
  undefined8 uVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  long *plVar12;
  P256NistzImpl *value;
  ostream *poVar13;
  size_t sVar14;
  const_iterator cVar15;
  long *plVar16;
  char *pcVar17;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  long lVar18;
  P256NistzImpl *pPVar19;
  TestParamInfo<P256NistzImpl> *pTVar20;
  undefined8 *puVar21;
  pointer pIVar22;
  byte bVar23;
  string param_name;
  string test_suite_name;
  string test_name;
  ParamGenerator<P256NistzImpl> generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  pointer local_1d0;
  string local_1c0;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  size_t local_180;
  char *local_178;
  undefined8 local_170;
  char local_168;
  undefined7 uStack_167;
  string local_158;
  undefined1 local_138 [72];
  size_t local_f0;
  long *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  CodeLocation local_d8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  ParamNameGeneratorFunc *local_98;
  char *local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  CodeLocation local_58;
  
  bVar23 = 0;
  local_1a0 = &local_190;
  local_198 = 0;
  local_190 = 0;
  local_178 = &local_168;
  local_170 = 0;
  local_168 = '\0';
  local_1d0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d0 != local_b0) {
    bVar8 = false;
    do {
      pIVar22 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_a8 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar22 != local_a8) {
        do {
          (*pIVar22->generator)(&local_e8);
          local_98 = pIVar22->name_func;
          __s = pIVar22->file;
          iVar10 = pIVar22->line;
          if ((pIVar22->name)._M_string_length == 0) {
            local_198 = 0;
            *local_1a0 = 0;
          }
          else {
            local_138._0_8_ = local_138 + 0x10;
            pcVar2 = (pIVar22->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_138,pcVar2,pcVar2 + (pIVar22->name)._M_string_length);
            std::__cxx11::string::append((char *)local_138);
            std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_138);
            if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
              operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_1a0,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_88._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_88._M_impl.super__Rb_tree_header._M_header;
          local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_88._M_impl.super__Rb_tree_header._M_header._M_right =
               local_88._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar11 = (long *)(**(code **)(*local_e8 + 0x10))();
          plVar12 = (long *)(**(code **)(*local_e8 + 0x18))();
          local_a0 = pIVar22;
          if (plVar11 != plVar12) {
            local_180 = 0;
            do {
              cVar7 = (**(code **)(*plVar11 + 0x30))(plVar11,plVar12);
              if (cVar7 != '\0') break;
              value = (P256NistzImpl *)(**(code **)(*plVar11 + 0x28))();
              local_170 = 0;
              *local_178 = '\0';
              pPVar19 = value;
              pTVar20 = (TestParamInfo<P256NistzImpl> *)local_138;
              for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pTVar20->param).name = pPVar19->name;
                pPVar19 = (P256NistzImpl *)((long)pPVar19 + (ulong)bVar23 * -0x10 + 8);
                pTVar20 = (TestParamInfo<P256NistzImpl> *)
                          ((long)pTVar20 + (ulong)bVar23 * -0x10 + 8);
              }
              local_f0 = local_180;
              (*local_98)(&local_1c0,(TestParamInfo<P256NistzImpl> *)local_138);
              bVar8 = IsValidParamName(&local_1c0);
              bVar8 = IsTrue(bVar8);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_1c0._M_dataplus._M_p,
                                     local_1c0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
                }
                else {
                  sVar14 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,__s,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," line ",6);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)local_138);
              }
              cVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_88,&local_1c0);
              bVar8 = IsTrue((_Rb_tree_header *)cVar15._M_node ==
                             &local_88._M_impl.super__Rb_tree_header);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_1c0._M_dataplus._M_p,
                                     local_1c0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
                }
                else {
                  sVar14 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,__s,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," line ",6);
                plVar16 = (long *)std::ostream::operator<<(poVar13,iVar10);
                std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
                std::ostream::put((char)plVar16);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)local_138);
              }
              peVar3 = (local_1d0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar3->test_base_name)._M_string_length != 0) {
                pcVar17 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_178,
                                             (ulong)(peVar3->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar17);
              }
              std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1c0._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_88,&local_1c0);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,local_1a0,local_1a0 + local_198);
              pcVar17 = local_178;
              PrintToString<P256NistzImpl>((string *)local_138,value);
              uVar6 = local_138._0_8_;
              peVar3 = (local_1d0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_d8.file._M_dataplus._M_p = (pointer)&local_d8.file.field_2;
              pcVar2 = (peVar3->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,pcVar2,
                         pcVar2 + (peVar3->code_location).file._M_string_length);
              local_90 = (char *)uVar6;
              local_d8.line = (peVar3->code_location).line;
              iVar9 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])();
              set_up_tc = SuiteApiResolver<P256NistzImplTest>::GetSetUpCaseOrSuite(__s,iVar10);
              tear_down_tc = SuiteApiResolver<P256NistzImplTest>::GetTearDownCaseOrSuite(__s,iVar10)
              ;
              _Var4.
              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>.
              _M_head_impl = (((local_1d0->
                               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->test_meta_factory)._M_t.
                             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<P256NistzImpl>,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
                             .
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
              ;
              pcVar5 = *(code **)(*(long *)_Var4.
                                           super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
                                           ._M_head_impl + 0x10);
              puVar21 = (undefined8 *)&stack0xfffffffffffffdc8;
              for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
                *puVar21 = value->name;
                value = (P256NistzImpl *)((long)value + (ulong)bVar23 * -0x10 + 8);
                puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
              }
              factory = (TestFactoryBase *)
                        (*pcVar5)(_Var4.
                                  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
                                  ._M_head_impl);
              MakeAndRegisterTestInfo
                        (&local_158,pcVar17,(char *)0x0,local_90,&local_d8,
                         (TypeId)CONCAT44(extraout_var,iVar9),set_up_tc,tear_down_tc,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8.file._M_dataplus._M_p != &local_d8.file.field_2) {
                operator_delete(local_d8.file._M_dataplus._M_p,
                                local_d8.file.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              (**(code **)(*plVar11 + 0x18))(plVar11);
              local_180 = local_180 + 1;
              bVar8 = true;
            } while (plVar11 != plVar12);
          }
          if (plVar12 != (long *)0x0) {
            (**(code **)(*plVar12 + 8))(plVar12);
          }
          pIVar22 = local_a0;
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_88);
          if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
          }
          pIVar22 = pIVar22 + 1;
        } while (pIVar22 != local_a8);
      }
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 != local_b0);
    if (bVar8) goto LAB_002ff9ae;
  }
  iVar10 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_58.file.field_2;
  pcVar2 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar10),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_002ff9ae:
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }